

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

void __thiscall duckdb::VacuumTask::~VacuumTask(VacuumTask *this)

{
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&(this->super_BaseCheckpointTask).super_BaseExecutorTask.super_Task.
                     super_enable_shared_from_this<duckdb::Task>.__weak_this_.internal.
                     super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2> + 8));
  operator_delete(this);
  return;
}

Assistant:

VacuumTask(CollectionCheckpointState &checkpoint_state, VacuumState &vacuum_state, idx_t segment_idx,
	           idx_t merge_count, idx_t target_count, idx_t merge_rows, idx_t row_start)
	    : BaseCheckpointTask(checkpoint_state), vacuum_state(vacuum_state), segment_idx(segment_idx),
	      merge_count(merge_count), target_count(target_count), merge_rows(merge_rows), row_start(row_start) {
	}